

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  FILE *pFVar1;
  bool bVar2;
  ulong uVar3;
  undefined8 uVar4;
  char *pcVar5;
  clock_t cVar6;
  long lVar7;
  bool local_2ba;
  float secs;
  clock_t time2;
  string report;
  string local_268 [7];
  bool pdbok;
  string pdbPath;
  undefined1 local_248 [8];
  MemoryMappedFile exeFile;
  string local_228 [37];
  byte local_203;
  byte local_202;
  allocator local_201;
  string local_200 [37];
  byte local_1db;
  byte local_1da;
  allocator local_1d9;
  string local_1d8 [39];
  allocator local_1b1;
  string local_1b0 [32];
  pointer local_190;
  clock_t time1;
  DebugInfo info;
  string local_70 [8];
  string file;
  undefined1 local_50 [8];
  DebugFilters filters;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  filters._48_8_ = argv;
  DebugFilters::DebugFilters((DebugFilters *)local_50);
  std::__cxx11::string::string(local_70);
  bVar2 = parse_cmdline(argc,(char **)filters._48_8_,(DebugFilters *)local_50,(string *)local_70);
  if (!bVar2) {
    argv_local._4_4_ = 0;
    info.m_Templates.super__Vector_base<TemplateInfo,_std::allocator<TemplateInfo>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
    goto LAB_00112c82;
  }
  DebugInfo::DebugInfo((DebugInfo *)&time1);
  local_190 = (pointer)clock();
  std::allocator<char>::allocator();
  local_1da = 0;
  local_1db = 0;
  local_202 = 0;
  local_203 = 0;
  exeFile.fileSize._6_1_ = 0;
  exeFile.fileSize._5_1_ = 0;
  std::__cxx11::string::string(local_1b0,".exe",&local_1b1);
  bVar2 = ends_with((string *)local_70,(string *)local_1b0);
  local_2ba = true;
  if (!bVar2) {
    std::allocator<char>::allocator();
    local_1da = 1;
    std::__cxx11::string::string(local_1d8,".dll",&local_1d9);
    local_1db = 1;
    bVar2 = ends_with((string *)local_70,(string *)local_1d8);
    local_2ba = true;
    if (!bVar2) {
      std::allocator<char>::allocator();
      local_202 = 1;
      std::__cxx11::string::string(local_200,".EXE",&local_201);
      local_203 = 1;
      bVar2 = ends_with((string *)local_70,(string *)local_200);
      local_2ba = true;
      if (!bVar2) {
        std::allocator<char>::allocator();
        exeFile.fileSize._6_1_ = 1;
        std::__cxx11::string::string(local_228,".DLL",(allocator *)((long)&exeFile.fileSize + 7));
        exeFile.fileSize._5_1_ = 1;
        local_2ba = ends_with((string *)local_70,(string *)local_228);
      }
    }
  }
  if ((exeFile.fileSize._5_1_ & 1) != 0) {
    std::__cxx11::string::~string(local_228);
  }
  if ((exeFile.fileSize._6_1_ & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)((long)&exeFile.fileSize + 7));
  }
  if ((local_203 & 1) != 0) {
    std::__cxx11::string::~string(local_200);
  }
  if ((local_202 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_201);
  }
  if ((local_1db & 1) != 0) {
    std::__cxx11::string::~string(local_1d8);
  }
  if ((local_1da & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
  }
  std::__cxx11::string::~string(local_1b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
  pFVar1 = _stderr;
  if (local_2ba == false) {
LAB_00112ab3:
    pFVar1 = _stderr;
    uVar4 = std::__cxx11::string::c_str();
    fprintf(pFVar1,"Reading debug info for %s ...\n",uVar4);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    bVar2 = ReadDebugInfo(pcVar5,(DebugInfo *)&time1);
    if (bVar2) {
      fprintf(_stderr,"\nProcessing info...\n");
      DebugInfo::ComputeDerivedData((DebugInfo *)&time1);
      fprintf(_stderr,"Generating report...\n");
      DebugInfo::WriteReport_abi_cxx11_((DebugInfo *)&time2,(DebugFilters *)&time1);
      cVar6 = clock();
      lVar7 = cVar6 - (long)local_190;
      fprintf(_stderr,"Printing...\n");
      pcVar5 = (char *)std::__cxx11::string::c_str();
      puts(pcVar5);
      fprintf(_stderr,"Done in %.2f seconds!\n",(double)((float)lVar7 / 1e+06));
      argv_local._4_4_ = 0;
      info.m_Templates.super__Vector_base<TemplateInfo,_std::allocator<TemplateInfo>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
      std::__cxx11::string::~string((string *)&time2);
    }
    else {
      fprintf(_stderr,"ERROR reading file via PDB\n");
      argv_local._4_4_ = 1;
      info.m_Templates.super__Vector_base<TemplateInfo,_std::allocator<TemplateInfo>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
    }
  }
  else {
    uVar4 = std::__cxx11::string::c_str();
    fprintf(pFVar1,"Finding debug location for %s ...\n",uVar4);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    MemoryMappedFile::MemoryMappedFile((MemoryMappedFile *)local_248,pcVar5);
    pFVar1 = _stderr;
    if (exeFile._0_8_ == 0) {
      uVar4 = std::__cxx11::string::c_str();
      fprintf(pFVar1,"ERROR: failed to memory-map file \'%s\'\n",uVar4);
      argv_local._4_4_ = 1;
      info.m_Templates.super__Vector_base<TemplateInfo,_std::allocator<TemplateInfo>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
    }
    else {
      PEGetPDBPath_abi_cxx11_(local_268,exeFile._0_8_);
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        std::__cxx11::string::operator=(local_70,local_268);
      }
      std::__cxx11::string::~string(local_268);
      info.m_Templates.super__Vector_base<TemplateInfo,_std::allocator<TemplateInfo>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
    }
    MemoryMappedFile::~MemoryMappedFile((MemoryMappedFile *)local_248);
    if ((int)info.m_Templates.super__Vector_base<TemplateInfo,_std::allocator<TemplateInfo>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage == 0) goto LAB_00112ab3;
  }
  DebugInfo::~DebugInfo((DebugInfo *)&time1);
LAB_00112c82:
  std::__cxx11::string::~string(local_70);
  DebugFilters::~DebugFilters((DebugFilters *)local_50);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char * const * argv)
{
    DebugFilters filters;
    std::string file;
    if (!parse_cmdline(argc, argv, filters, file))
    {
        return 0;
    }

    DebugInfo info;

    clock_t time1 = clock();

    if (ends_with(file, ".exe") || ends_with(file, ".dll") || ends_with(file, ".EXE") || ends_with(file, ".DLL"))
    {
        fprintf(stderr, "Finding debug location for %s ...\n", file.c_str());
        MemoryMappedFile exeFile(file.c_str());
        if (exeFile.baseAddress == nullptr)
        {
            fprintf(stderr, "ERROR: failed to memory-map file '%s'\n", file.c_str());
            return 1;
        }
        std::string pdbPath = PEGetPDBPath(exeFile.baseAddress, exeFile.fileSize);
        if (!pdbPath.empty())
            file = pdbPath;
    }

    fprintf(stderr, "Reading debug info for %s ...\n", file.c_str());
    bool pdbok = ReadDebugInfo(file.c_str(), info);
    if (!pdbok)
    {
        fprintf(stderr, "ERROR reading file via PDB\n");
        return 1;
    }
    fprintf(stderr, "\nProcessing info...\n");
    info.ComputeDerivedData();

    fprintf(stderr, "Generating report...\n");
    std::string report = info.WriteReport(filters);

    clock_t time2 = clock();
    float secs = float(time2 - time1) / CLOCKS_PER_SEC;

    fprintf(stderr, "Printing...\n");
    puts(report.c_str());
    fprintf(stderr, "Done in %.2f seconds!\n", secs);


    return 0;
}